

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compressWeights(void *dst,size_t dstSize,void *weightTable,size_t wtSize)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  size_t cSize;
  size_t _var_err___1;
  size_t hSize;
  size_t _var_err__;
  short local_1e8 [2];
  uint maxCount;
  S16 norm [13];
  uint count [13];
  undefined1 local_188 [8];
  BYTE scratchBuffer [64];
  FSE_CTable CTable [59];
  uint local_4c;
  U32 tableLog;
  uint maxSymbolValue;
  BYTE *oend;
  BYTE *op;
  BYTE *ostart;
  size_t wtSize_local;
  void *weightTable_local;
  size_t dstSize_local;
  void *dst_local;
  
  _tableLog = (long)dst + dstSize;
  local_4c = 0xc;
  if (wtSize < 2) {
    dst_local = (void *)0x0;
  }
  else {
    oend = (BYTE *)dst;
    op = (BYTE *)dst;
    ostart = (BYTE *)wtSize;
    wtSize_local = (size_t)weightTable;
    weightTable_local = (void *)dstSize;
    dstSize_local = (size_t)dst;
    uVar1 = HIST_count_simple((uint *)(norm + 0xc),&local_4c,weightTable,wtSize);
    if ((BYTE *)(ulong)uVar1 == ostart) {
      dst_local = (void *)0x1;
    }
    else if (uVar1 == 1) {
      dst_local = (void *)0x0;
    }
    else {
      uVar1 = FSE_optimalTableLog(6,(size_t)ostart,local_4c);
      pvVar3 = (void *)FSE_normalizeCount(local_1e8,uVar1,(uint *)(norm + 0xc),(size_t)ostart,
                                          local_4c);
      uVar2 = ERR_isError((size_t)pvVar3);
      dst_local = pvVar3;
      if (uVar2 == 0) {
        pvVar3 = (void *)FSE_writeNCount(oend,_tableLog - (long)oend,local_1e8,local_4c,uVar1);
        uVar2 = ERR_isError((size_t)pvVar3);
        dst_local = pvVar3;
        if (uVar2 == 0) {
          oend = (BYTE *)((long)pvVar3 + (long)oend);
          pvVar3 = (void *)FSE_buildCTable_wksp
                                     ((FSE_CTable *)(scratchBuffer + 0x38),local_1e8,local_4c,uVar1,
                                      local_188,0x40);
          uVar1 = ERR_isError((size_t)pvVar3);
          dst_local = pvVar3;
          if (uVar1 == 0) {
            pvVar3 = (void *)FSE_compress_usingCTable
                                       (oend,_tableLog - (long)oend,(void *)wtSize_local,
                                        (size_t)ostart,(FSE_CTable *)(scratchBuffer + 0x38));
            uVar1 = ERR_isError((size_t)pvVar3);
            dst_local = pvVar3;
            if (uVar1 == 0) {
              if (pvVar3 == (void *)0x0) {
                dst_local = (void *)0x0;
              }
              else {
                dst_local = (BYTE *)((long)pvVar3 + (long)oend) + -(long)op;
              }
            }
          }
        }
      }
    }
  }
  return (size_t)dst_local;
}

Assistant:

static size_t HUF_compressWeights (void* dst, size_t dstSize, const void* weightTable, size_t wtSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    unsigned maxSymbolValue = HUF_TABLELOG_MAX;
    U32 tableLog = MAX_FSE_TABLELOG_FOR_HUFF_HEADER;

    FSE_CTable CTable[FSE_CTABLE_SIZE_U32(MAX_FSE_TABLELOG_FOR_HUFF_HEADER, HUF_TABLELOG_MAX)];
    BYTE scratchBuffer[1<<MAX_FSE_TABLELOG_FOR_HUFF_HEADER];

    unsigned count[HUF_TABLELOG_MAX+1];
    S16 norm[HUF_TABLELOG_MAX+1];

    /* init conditions */
    if (wtSize <= 1) return 0;  /* Not compressible */

    /* Scan input and build symbol stats */
    {   unsigned const maxCount = HIST_count_simple(count, &maxSymbolValue, weightTable, wtSize);   /* never fails */
        if (maxCount == wtSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;        /* each symbol present maximum once => not compressible */
    }

    tableLog = FSE_optimalTableLog(tableLog, wtSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, wtSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(hSize, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += hSize;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, sizeof(scratchBuffer)) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, weightTable, wtSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    return op-ostart;
}